

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

PragmaInstr * IR::PragmaInstr::New(OpCode opcode,uint32 index,Func *func)

{
  PragmaInstr *this;
  
  this = (PragmaInstr *)new<Memory::JitArenaAllocator>(0x60,func->m_alloc,0x3d6ef4);
  PragmaInstr(this);
  Instr::Init((Instr *)this,opcode,InstrKindPragma,func);
  this->m_statementIndex = index;
  return this;
}

Assistant:

PragmaInstr *
PragmaInstr::New(Js::OpCode opcode, uint32 index, Func *func)
{
    PragmaInstr * pragmaInstr;

    pragmaInstr = JitAnew(func->m_alloc, IR::PragmaInstr);
    pragmaInstr->Init(opcode, InstrKindPragma, func);
    pragmaInstr->m_statementIndex = index;

    return pragmaInstr;
}